

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-junk.c
# Opt level: O0

_Bool borg_consume(wchar_t i)

{
  borg_item_conflict *pbVar1;
  _Bool _Var2;
  borg_item *item;
  wchar_t i_local;
  
  pbVar1 = borg_items;
  if ((borg_items[i].aware & 1U) == 0) {
    return false;
  }
  switch(borg_items[i].tval) {
  case '\x19':
    if ((((((uint)borg_items[i].sval == sv_scroll_light) ||
          ((uint)borg_items[i].sval == sv_scroll_monster_confusion)) ||
         ((uint)borg_items[i].sval == sv_scroll_trap_door_destruction)) ||
        ((((uint)borg_items[i].sval == sv_scroll_satisfy_hunger ||
          ((uint)borg_items[i].sval == sv_scroll_dispel_undead)) ||
         (((uint)borg_items[i].sval == sv_scroll_blessing ||
          (((uint)borg_items[i].sval == sv_scroll_holy_chant ||
           ((uint)borg_items[i].sval == sv_scroll_holy_prayer)))))))) &&
       (_Var2 = borg_read_scroll((uint)borg_items[i].sval), _Var2)) {
      return true;
    }
    break;
  case '\x1a':
    if (((((((uint)borg_items[i].sval == sv_potion_slime_mold) ||
           ((uint)borg_items[i].sval == sv_potion_cure_light)) ||
          (((uint)borg_items[i].sval == sv_potion_cure_serious ||
           ((((uint)borg_items[i].sval == sv_potion_cure_critical ||
             ((uint)borg_items[i].sval == sv_potion_healing)) ||
            ((uint)borg_items[i].sval == sv_potion_star_healing)))))) ||
         (((uint)borg_items[i].sval == sv_potion_life ||
          ((uint)borg_items[i].sval == sv_potion_restore_life)))) ||
        ((uint)borg_items[i].sval == sv_potion_restore_mana)) ||
       (((((uint)borg_items[i].sval == sv_potion_heroism ||
          ((uint)borg_items[i].sval == sv_potion_berserk)) ||
         (((uint)borg_items[i].sval == sv_potion_resist_heat ||
          (((((uint)borg_items[i].sval == sv_potion_resist_cold ||
             ((uint)borg_items[i].sval == sv_potion_infravision)) ||
            ((uint)borg_items[i].sval == sv_potion_detect_invis)) ||
           (((uint)borg_items[i].sval == sv_potion_cure_poison ||
            ((uint)borg_items[i].sval == sv_potion_speed)))))))) ||
        ((uint)borg_items[i].sval == sv_potion_inc_exp)))) {
      _Var2 = borg_quaff_potion((uint)borg_items[i].sval);
      if (_Var2) {
        return true;
      }
    }
    else {
      if ((uint)borg_items[i].sval == sv_potion_inc_str2) {
        if (0x75 < borg.trait[10]) {
          return false;
        }
        if (((borg.trait[0x19] == 1) || (borg.trait[0x19] == 2)) || (borg.trait[0x19] == 4)) {
          return false;
        }
        _Var2 = borg_quaff_potion((uint)borg_items[i].sval);
        if (_Var2) {
          return true;
        }
      }
      if ((uint)pbVar1[i].sval == sv_potion_inc_int2) {
        if (0x75 < borg.trait[0xb]) {
          return false;
        }
        if ((borg.trait[0x19] != 1) && (borg.trait[0x19] != 4)) {
          return false;
        }
        _Var2 = borg_quaff_potion((uint)pbVar1[i].sval);
        if (_Var2) {
          return true;
        }
      }
      else if ((uint)pbVar1[i].sval == sv_potion_inc_wis2) {
        if (0x75 < borg.trait[0xc]) {
          return false;
        }
        if ((borg.trait[0x19] != 3) && (borg.trait[0x19] != 2)) {
          return false;
        }
        _Var2 = borg_quaff_potion((uint)pbVar1[i].sval);
        if (_Var2) {
          return true;
        }
      }
      else if ((uint)pbVar1[i].sval == sv_potion_inc_dex2) {
        if (0x75 < borg.trait[0xd]) {
          return false;
        }
        if ((((borg.trait[0x19] == 1) || (borg.trait[0x19] == 3)) || (borg.trait[0x19] == 2)) ||
           (borg.trait[0x19] == 4)) {
          return false;
        }
        _Var2 = borg_quaff_potion((uint)pbVar1[i].sval);
        if (_Var2) {
          return true;
        }
      }
      else if ((uint)pbVar1[i].sval == sv_potion_inc_con2) {
        if (0x75 < borg.trait[0xe]) {
          return false;
        }
        _Var2 = borg_quaff_potion((uint)pbVar1[i].sval);
        if (_Var2) {
          return true;
        }
      }
    }
    break;
  case '\x1c':
    if (((((uint)borg_items[i].sval == sv_food_ration) ||
         ((uint)borg_items[i].sval == sv_food_slime_mold)) ||
        ((uint)borg_items[i].sval == sv_food_waybread)) &&
       ((borg.trait[0x6e] == 0 &&
        (_Var2 = borg_eat((uint)borg_items[i].tval,(uint)borg_items[i].sval), _Var2)))) {
      return true;
    }
    break;
  case '\x1d':
    if ((((((((uint)borg_items[i].sval == sv_mush_second_sight) ||
            ((uint)borg_items[i].sval == sv_mush_fast_recovery)) ||
           ((uint)borg_items[i].sval == sv_mush_cure_mind)) ||
          (((uint)borg_items[i].sval == sv_mush_restoring ||
           ((uint)borg_items[i].sval == sv_mush_emergency)))) ||
         ((uint)borg_items[i].sval == sv_mush_terror)) ||
        ((((uint)borg_items[i].sval == sv_mush_stoneskin ||
          ((uint)borg_items[i].sval == sv_mush_debility)) ||
         (((uint)borg_items[i].sval == sv_mush_sprinting ||
          ((uint)borg_items[i].sval == sv_mush_purging)))))) &&
       ((borg.trait[0x6e] == 0 &&
        (_Var2 = borg_eat((uint)borg_items[i].tval,(uint)borg_items[i].sval), _Var2)))) {
      return true;
    }
  }
  return false;
}

Assistant:

static bool borg_consume(int i)
{
    borg_item *item = &borg_items[i];

    if (!item->aware)
        return false;

    /* Special destruction */
    switch (item->tval) {
    case TV_POTION:

        /* Check the potion */
        if (item->sval == sv_potion_slime_mold
            || item->sval == sv_potion_cure_light
            || item->sval == sv_potion_cure_serious
            || item->sval == sv_potion_cure_critical
            || item->sval == sv_potion_healing
            || item->sval == sv_potion_star_healing
            || item->sval == sv_potion_life
            || item->sval == sv_potion_restore_life
            || item->sval == sv_potion_restore_mana
            || item->sval == sv_potion_heroism
            || item->sval == sv_potion_berserk
            || item->sval == sv_potion_resist_heat
            || item->sval == sv_potion_resist_cold
            || item->sval == sv_potion_infravision
            || item->sval == sv_potion_detect_invis
            || item->sval == sv_potion_cure_poison
            || item->sval == sv_potion_speed
            || item->sval == sv_potion_inc_exp) {
            /* Try quaffing the potion */
            if (borg_quaff_potion(item->sval))
                return true;
            break;
        }

        /* Gain one/lose one potions */
        if (item->sval == sv_potion_inc_str2) {
            /* Maxed out no need. Don't lose another stat */
            if (borg.trait[BI_CSTR] >= 118)
                return false;

            /* This class does not want to risk losing a different stat */
            if (borg.trait[BI_CLASS] == CLASS_MAGE
                || borg.trait[BI_CLASS] == CLASS_DRUID
                || borg.trait[BI_CLASS] == CLASS_NECROMANCER)
                return false;

            /* Otherwise, it should be ok */
            if (borg_quaff_potion(item->sval))
                return true;
        }

        if (item->sval == sv_potion_inc_int2) {
            /* Maxed out no need. Don't lose another stat */
            if (borg.trait[BI_CINT] >= 118)
                return false;

            /* This class does not want to risk losing a different stat */
            if (borg.trait[BI_CLASS] != CLASS_MAGE
                && borg.trait[BI_CLASS] != CLASS_NECROMANCER)
                return false;

            /* Otherwise, it should be ok */
            if (borg_quaff_potion(item->sval))
                return true;
            break;
        }

        if (item->sval == sv_potion_inc_wis2) {
            /* Maxed out no need. Don't lose another stat */
            if (borg.trait[BI_CWIS] >= 118)
                return false;

            /* This class does not want to risk losing a different stat */
            if (borg.trait[BI_CLASS] != CLASS_PRIEST
                && borg.trait[BI_CLASS] != CLASS_DRUID)
                return false;

            /* Otherwise, it should be ok */
            if (borg_quaff_potion(item->sval))
                return true;
            break;
        }

        if (item->sval == sv_potion_inc_dex2) {
            /* Maxed out no need. Don't lose another stat */
            if (borg.trait[BI_CDEX] >= 118)
                return false;

            /* This class does not want to risk losing a different stat */
            if (borg.trait[BI_CLASS] == CLASS_MAGE
                || borg.trait[BI_CLASS] == CLASS_PRIEST
                || borg.trait[BI_CLASS] == CLASS_DRUID
                || borg.trait[BI_CLASS] == CLASS_NECROMANCER)
                return false;

            /* Otherwise, it should be ok */
            if (borg_quaff_potion(item->sval))
                return true;
            break;
        }

        if (item->sval == sv_potion_inc_con2) {
            /* Maxed out no need. Don't lose another stat */
            if (borg.trait[BI_CCON] >= 118)
                return false;

            /* Otherwise, it should be ok */
            if (borg_quaff_potion(item->sval))
                return true;
            break;
        }

        break;

    case TV_SCROLL:

        /* Check the scroll */
        if (item->sval == sv_scroll_light
            || item->sval == sv_scroll_monster_confusion
            || item->sval == sv_scroll_trap_door_destruction
            || item->sval == sv_scroll_satisfy_hunger
            || item->sval == sv_scroll_dispel_undead
            || item->sval == sv_scroll_blessing
            || item->sval == sv_scroll_holy_chant
            || item->sval == sv_scroll_holy_prayer) {
            /* Try reading the scroll */
            if (borg_read_scroll(item->sval))
                return true;
        }

        break;

    case TV_FOOD:
        /* Check the grub */
        if (item->sval == sv_food_ration 
            || item->sval == sv_food_slime_mold
            || item->sval == sv_food_waybread)

            /* Try eating the food (unless Bloated) */
            if (!borg.trait[BI_ISFULL] && borg_eat(item->tval, item->sval))
                return true;

        break;

    case TV_MUSHROOM:

        /* Check the grub */
        if (item->sval == sv_mush_second_sight
            || item->sval == sv_mush_fast_recovery
            || item->sval == sv_mush_cure_mind
            || item->sval == sv_mush_restoring
            || item->sval == sv_mush_emergency 
            || item->sval == sv_mush_terror
            || item->sval == sv_mush_stoneskin 
            || item->sval == sv_mush_debility
            || item->sval == sv_mush_sprinting 
            || item->sval == sv_mush_purging)

            /* Try eating the food (unless Bloated) */
            if (!borg.trait[BI_ISFULL] && borg_eat(item->tval, item->sval))
                return true;

        break;
    }

    /* Nope */
    return false;
}